

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmanager.h
# Opt level: O1

void __thiscall Memory::show(Memory *this)

{
  ostream *poVar1;
  int *piVar2;
  long lVar3;
  
  piVar2 = &this->Mem[0].thread_id;
  lVar3 = 0;
  do {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,piVar2[-1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*piVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(((string *)(piVar2 + -9))->_M_dataplus)._M_p,
                        *(size_type *)(piVar2 + -7));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,((Data *)(piVar2 + -0x13))->datasize);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(((string *)(piVar2 + -0x11))->_M_dataplus)._M_p,
                        *(size_type *)(piVar2 + -0xf));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar3 = lVar3 + 1;
    piVar2 = piVar2 + 0x14;
  } while (lVar3 != 0x10);
  return;
}

Assistant:

void show() { //显示内存数据
			for(int i=0; i<16; i++) {
				cout<<i<<" "<<Mem[i].sign<<" "<<Mem[i].thread_id<<" "<<Mem[i].name<<" "<<Mem[i].datasize<<" "<<Mem[i].message<<endl;
			}
		}